

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O3

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  cmCTest *pcVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong *puVar10;
  size_type *psVar11;
  int iVar12;
  undefined8 uVar13;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg;
  string buildname;
  cmGeneratedFileStream ofs;
  string local_4f8;
  undefined1 local_4d8 [88];
  cmCTestUploadHandler *local_480;
  string local_478;
  _Rb_tree_node_base *local_458;
  undefined1 local_450 [112];
  ios_base local_3e0 [264];
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream local_298;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_298,None);
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_450,pcVar4);
  pcVar1 = local_4d8 + 0x10;
  local_4d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"Upload.xml","");
  bVar5 = cmCTest::OpenOutputFile(pcVar4,(string *)local_450,(string *)local_4d8,&local_298,false);
  if ((char *)local_4d8._0_8_ != pcVar1) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  plVar3 = (long *)(local_450 + 0x10);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_450,"Cannot open Upload.xml file",0x1b);
    std::ios::widen((char)(ostream *)local_450 + (char)*(long *)(local_450._0_8_ + -0x18));
    std::ostream::put((char)local_450);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x24,(char *)local_4d8._0_8_,false);
    if ((char *)local_4d8._0_8_ != pcVar1) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
    std::ios_base::~ios_base(local_3e0);
    iVar12 = -1;
    goto LAB_00223d7a;
  }
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  local_4d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"BuildName","");
  cmCTest::GetCTestConfiguration((string *)local_450,pcVar4,(string *)local_4d8);
  cmCTest::SafeBuildIdField(&local_2b8,(string *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((char *)local_4d8._0_8_ != pcVar1) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_4d8,(ostream *)&local_298,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_4d8,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            ((cmXMLWriter *)local_4d8,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  local_450._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Site","");
  cmXMLWriter::StartElement((cmXMLWriter *)local_4d8,(string *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_4d8,"BuildName",&local_2b8);
  cmCTest::GetCurrentTag_abi_cxx11_(&local_2d8,(this->super_cmCTestGenericHandler).CTest);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  paVar2 = &local_4f8.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_4f8.field_2._M_allocated_capacity = *puVar10;
    local_4f8.field_2._8_8_ = plVar6[3];
    local_4f8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_4f8.field_2._M_allocated_capacity = *puVar10;
    local_4f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_4f8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cmCTest::GetTestModelString_abi_cxx11_(&local_478,(this->super_cmCTestGenericHandler).CTest);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar2) {
    uVar13 = local_4f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_478._M_string_length + local_4f8._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      uVar13 = local_478.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_478._M_string_length + local_4f8._M_string_length) goto LAB_00223831;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_478,0,(char *)0x0,(ulong)local_4f8._M_dataplus._M_p);
  }
  else {
LAB_00223831:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_478._M_dataplus._M_p);
  }
  psVar11 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar11) {
    local_450._16_8_ = *psVar11;
    local_450._24_8_ = puVar7[3];
    local_450._0_8_ = plVar3;
  }
  else {
    local_450._16_8_ = *psVar11;
    local_450._0_8_ = (size_type *)*puVar7;
  }
  local_450._8_8_ = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4d8,"BuildStamp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  local_4f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"Site","");
  cmCTest::GetCTestConfiguration((string *)local_450,pcVar4,&local_4f8);
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4d8,"Name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  local_4f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"ctest-","");
  cmVersion::GetCMakeVersion();
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_4f8);
  psVar11 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar11) {
    local_450._16_8_ = *psVar11;
    local_450._24_8_ = puVar7[3];
    local_450._0_8_ = plVar3;
  }
  else {
    local_450._16_8_ = *psVar11;
    local_450._0_8_ = (size_type *)*puVar7;
  }
  local_450._8_8_ = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4d8,"Generator",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_4d8);
  local_450._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Upload","");
  cmXMLWriter::StartElement((cmXMLWriter *)local_4d8,(string *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  local_450._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Time","");
  local_4f8._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ((cmXMLWriter *)local_4d8,(string *)local_450,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&local_4f8);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  p_Var9 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_458 = &(this->Files)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_480 = this;
  if (p_Var9 != local_458) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\tUpload file: ",0xe)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_450,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3e,local_4f8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      std::ios_base::~ios_base(local_3e0);
      local_450._0_8_ = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"File","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_4d8,(string *)local_450);
      if ((long *)local_450._0_8_ != plVar3) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_4d8,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
      local_450._0_8_ = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Content","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_4d8,(string *)local_450);
      if ((long *)local_450._0_8_ != plVar3) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_4d8,"encoding",(char (*) [7])"base64");
      cmCTest::Base64EncodeFile
                ((string *)local_450,(local_480->super_cmCTestGenericHandler).CTest,
                 (string *)(p_Var9 + 1));
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_4d8,(string *)local_450);
      if ((long *)local_450._0_8_ != plVar3) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_4d8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_4d8);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_458);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_4d8);
  cmXMLWriter::EndElement((cmXMLWriter *)local_4d8);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_4d8);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  iVar12 = 0;
LAB_00223d7a:
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_298);
  return iVar12;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open Upload.xml file" << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");
  xml.Element("Time", std::chrono::system_clock::now());

  for (std::string const& file : this->Files) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << file << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", file);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(file));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}